

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Catch * __thiscall Catch::toString(Catch *this,string *value)

{
  char cVar1;
  uint uVar2;
  IConfig *pIVar3;
  ulong uVar4;
  char *pcVar5;
  string local_118 [32];
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  string local_78 [8];
  string subs;
  ulong local_58;
  size_t i;
  IConfig *config;
  string s;
  string *value_local;
  
  std::__cxx11::string::string((string *)&config,(string *)value);
  pIVar3 = getGlobalConfig();
  if ((pIVar3 != (IConfig *)0x0) &&
     (uVar2 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])(),
     (uVar2 & 1) != 0)) {
    for (local_58 = 0; uVar4 = std::__cxx11::string::size(), local_58 < uVar4;
        local_58 = local_58 + 1) {
      std::__cxx11::string::string(local_78);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&config);
      cVar1 = *pcVar5;
      if (cVar1 == '\t') {
        std::__cxx11::string::operator=(local_78,"\\t");
      }
      else if (cVar1 == '\n') {
        std::__cxx11::string::operator=(local_78,"\\n");
      }
      else if (cVar1 == '\r') {
        std::__cxx11::string::operator=(local_78,"\\r");
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::substr((ulong)local_d8,(ulong)&config);
        std::operator+(local_b8,local_d8);
        std::__cxx11::string::substr((ulong)local_f8,(ulong)&config);
        std::operator+(local_98,local_b8);
        std::__cxx11::string::operator=((string *)&config,(string *)local_98);
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::~string((string *)local_b8);
        std::__cxx11::string::~string((string *)local_d8);
        local_58 = local_58 + 1;
      }
      std::__cxx11::string::~string(local_78);
    }
  }
  std::operator+((char *)local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c490c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_118);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string((string *)&config);
  return this;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    IConfig const* config = getGlobalConfig();
    if( config && config->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\r': subs = "\\r"; break;
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}